

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::MergeFrom
          (UninterpretedOption *this,UninterpretedOption *from)

{
  bool bVar1;
  LogMessage *other;
  uint64 value;
  int64 value_00;
  string *psVar2;
  UnknownFieldSet *this_00;
  UnknownFieldSet *other_00;
  double value_01;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  UninterpretedOption *local_18;
  UninterpretedOption *from_local;
  UninterpretedOption *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1d1f);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::MergeFrom
            (&this->name_,&local_18->name_);
  if ((local_18->_has_bits_[0] & 0x1fe) != 0) {
    bVar1 = has_identifier_value(local_18);
    if (bVar1) {
      psVar2 = identifier_value_abi_cxx11_(local_18);
      set_identifier_value(this,psVar2);
    }
    bVar1 = has_positive_int_value(local_18);
    if (bVar1) {
      value = positive_int_value(local_18);
      set_positive_int_value(this,value);
    }
    bVar1 = has_negative_int_value(local_18);
    if (bVar1) {
      value_00 = negative_int_value(local_18);
      set_negative_int_value(this,value_00);
    }
    bVar1 = has_double_value(local_18);
    if (bVar1) {
      value_01 = double_value(local_18);
      set_double_value(this,value_01);
    }
    bVar1 = has_string_value(local_18);
    if (bVar1) {
      psVar2 = string_value_abi_cxx11_(local_18);
      set_string_value(this,psVar2);
    }
    bVar1 = has_aggregate_value(local_18);
    if (bVar1) {
      psVar2 = aggregate_value_abi_cxx11_(local_18);
      set_aggregate_value(this,psVar2);
    }
  }
  this_00 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_00,other_00);
  return;
}

Assistant:

void UninterpretedOption::MergeFrom(const UninterpretedOption& from) {
  GOOGLE_CHECK_NE(&from, this);
  name_.MergeFrom(from.name_);
  if (from._has_bits_[1 / 32] & (0xffu << (1 % 32))) {
    if (from.has_identifier_value()) {
      set_identifier_value(from.identifier_value());
    }
    if (from.has_positive_int_value()) {
      set_positive_int_value(from.positive_int_value());
    }
    if (from.has_negative_int_value()) {
      set_negative_int_value(from.negative_int_value());
    }
    if (from.has_double_value()) {
      set_double_value(from.double_value());
    }
    if (from.has_string_value()) {
      set_string_value(from.string_value());
    }
    if (from.has_aggregate_value()) {
      set_aggregate_value(from.aggregate_value());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}